

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O0

void __thiscall
spdlog::details::c_formatter<spdlog::details::scoped_padder>::format
          (c_formatter<spdlog::details::scoped_padder> *this,log_msg *param_2,tm *tm_time,
          memory_buf_t *dest)

{
  string_view_t view;
  string_view_t view_00;
  scoped_padder p;
  size_t field_size;
  undefined4 in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff7c;
  undefined1 uVar1;
  undefined1 in_stack_ffffffffffffff7d;
  undefined1 uVar2;
  undefined1 in_stack_ffffffffffffff7e;
  undefined1 uVar3;
  undefined1 in_stack_ffffffffffffff7f;
  undefined1 uVar4;
  scoped_padder *in_stack_ffffffffffffff80;
  memory_buf_t *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 uVar5;
  int in_stack_ffffffffffffff94;
  char *in_stack_ffffffffffffff98;
  scoped_padder *in_stack_ffffffffffffffa0;
  memory_buf_t *in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffb4;
  
  scoped_padder::scoped_padder
            (in_stack_ffffffffffffffa0,(size_t)in_stack_ffffffffffffff98,
             (padding_info *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
             in_stack_ffffffffffffff88);
  std::array<const_char_*,_7UL>::operator[]
            ((array<const_char_*,_7UL> *)in_stack_ffffffffffffff80,
             CONCAT17(in_stack_ffffffffffffff7f,
                      CONCAT16(in_stack_ffffffffffffff7e,
                               CONCAT15(in_stack_ffffffffffffff7d,
                                        CONCAT14(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78
                                                )))));
  ::fmt::v6::basic_string_view<char>::basic_string_view
            ((basic_string_view<char> *)in_stack_ffffffffffffff80,
             (char *)CONCAT17(in_stack_ffffffffffffff7f,
                              CONCAT16(in_stack_ffffffffffffff7e,
                                       CONCAT15(in_stack_ffffffffffffff7d,
                                                CONCAT14(in_stack_ffffffffffffff7c,
                                                         in_stack_ffffffffffffff78)))));
  view.size_ = (size_t)in_stack_ffffffffffffffa0;
  view.data_ = in_stack_ffffffffffffff98;
  fmt_helper::append_string_view
            (view,(memory_buf_t *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
  uVar5 = CONCAT13(0x20,(int3)in_stack_ffffffffffffff90);
  ::fmt::v6::internal::buffer<char>::push_back
            ((buffer<char> *)in_stack_ffffffffffffff80,
             (char *)CONCAT17(in_stack_ffffffffffffff7f,
                              CONCAT16(in_stack_ffffffffffffff7e,
                                       CONCAT15(in_stack_ffffffffffffff7d,
                                                CONCAT14(in_stack_ffffffffffffff7c,
                                                         in_stack_ffffffffffffff78)))));
  std::array<const_char_*,_12UL>::operator[]
            ((array<const_char_*,_12UL> *)in_stack_ffffffffffffff80,
             CONCAT17(in_stack_ffffffffffffff7f,
                      CONCAT16(in_stack_ffffffffffffff7e,
                               CONCAT15(in_stack_ffffffffffffff7d,
                                        CONCAT14(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78
                                                )))));
  ::fmt::v6::basic_string_view<char>::basic_string_view
            ((basic_string_view<char> *)in_stack_ffffffffffffff80,
             (char *)CONCAT17(in_stack_ffffffffffffff7f,
                              CONCAT16(in_stack_ffffffffffffff7e,
                                       CONCAT15(in_stack_ffffffffffffff7d,
                                                CONCAT14(in_stack_ffffffffffffff7c,
                                                         in_stack_ffffffffffffff78)))));
  view_00.size_ = (size_t)in_stack_ffffffffffffffa0;
  view_00.data_ = in_stack_ffffffffffffff98;
  fmt_helper::append_string_view(view_00,(memory_buf_t *)CONCAT44(in_stack_ffffffffffffff94,uVar5));
  uVar4 = 0x20;
  ::fmt::v6::internal::buffer<char>::push_back
            ((buffer<char> *)in_stack_ffffffffffffff80,
             (char *)CONCAT17(0x20,CONCAT16(in_stack_ffffffffffffff7e,
                                            CONCAT15(in_stack_ffffffffffffff7d,
                                                     CONCAT14(in_stack_ffffffffffffff7c,
                                                              in_stack_ffffffffffffff78)))));
  fmt_helper::append_int<int>(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffa8);
  uVar3 = 0x20;
  ::fmt::v6::internal::buffer<char>::push_back
            ((buffer<char> *)in_stack_ffffffffffffff80,
             (char *)CONCAT17(uVar4,CONCAT16(0x20,CONCAT15(in_stack_ffffffffffffff7d,
                                                           CONCAT14(in_stack_ffffffffffffff7c,
                                                                    in_stack_ffffffffffffff78)))));
  fmt_helper::pad2(in_stack_ffffffffffffff94,in_stack_ffffffffffffff88);
  uVar2 = 0x3a;
  ::fmt::v6::internal::buffer<char>::push_back
            ((buffer<char> *)in_stack_ffffffffffffff80,
             (char *)CONCAT17(uVar4,CONCAT16(uVar3,CONCAT15(0x3a,CONCAT14(in_stack_ffffffffffffff7c,
                                                                          in_stack_ffffffffffffff78)
                                                           ))));
  fmt_helper::pad2(in_stack_ffffffffffffff94,in_stack_ffffffffffffff88);
  uVar1 = 0x3a;
  ::fmt::v6::internal::buffer<char>::push_back
            ((buffer<char> *)in_stack_ffffffffffffff80,
             (char *)CONCAT17(uVar4,CONCAT16(uVar3,CONCAT15(uVar2,CONCAT14(0x3a,
                                                  in_stack_ffffffffffffff78)))));
  fmt_helper::pad2(in_stack_ffffffffffffff94,in_stack_ffffffffffffff88);
  ::fmt::v6::internal::buffer<char>::push_back
            ((buffer<char> *)in_stack_ffffffffffffff80,
             (char *)CONCAT17(uVar4,CONCAT16(uVar3,CONCAT15(uVar2,CONCAT14(uVar1,CONCAT13(0x20,(int3
                                                  )in_stack_ffffffffffffff78))))));
  fmt_helper::append_int<int>(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffa8);
  scoped_padder::~scoped_padder(in_stack_ffffffffffffff80);
  return;
}

Assistant:

void format(const details::log_msg &, const std::tm &tm_time, memory_buf_t &dest) override
    {
        const size_t field_size = 24;
        ScopedPadder p(field_size, padinfo_, dest);

        fmt_helper::append_string_view(days[static_cast<size_t>(tm_time.tm_wday)], dest);
        dest.push_back(' ');
        fmt_helper::append_string_view(months[static_cast<size_t>(tm_time.tm_mon)], dest);
        dest.push_back(' ');
        fmt_helper::append_int(tm_time.tm_mday, dest);
        dest.push_back(' ');
        // time

        fmt_helper::pad2(tm_time.tm_hour, dest);
        dest.push_back(':');
        fmt_helper::pad2(tm_time.tm_min, dest);
        dest.push_back(':');
        fmt_helper::pad2(tm_time.tm_sec, dest);
        dest.push_back(' ');
        fmt_helper::append_int(tm_time.tm_year + 1900, dest);
    }